

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O1

String * __thiscall
Hpipe::Cond::ko_cpp(String *__return_storage_ptr__,Cond *this,String *var,Cond *not_in)

{
  _WordT *p_Var1;
  pointer pcVar2;
  size_t __i;
  long lVar3;
  String local_68;
  Cond local_48;
  
  local_48.p.super__Base_bitset<4UL>._M_w[2]._0_4_ = (int)(this->p).super__Base_bitset<4UL>._M_w[2];
  local_48.p.super__Base_bitset<4UL>._M_w[2]._4_4_ =
       *(undefined4 *)((long)(this->p).super__Base_bitset<4UL>._M_w + 0x14);
  local_48.p.super__Base_bitset<4UL>._M_w[3]._0_4_ = (int)(this->p).super__Base_bitset<4UL>._M_w[3];
  local_48.p.super__Base_bitset<4UL>._M_w[3]._4_4_ =
       *(undefined4 *)((long)(this->p).super__Base_bitset<4UL>._M_w + 0x1c);
  local_48.p.super__Base_bitset<4UL>._M_w[0]._0_4_ = (int)(this->p).super__Base_bitset<4UL>._M_w[0];
  local_48.p.super__Base_bitset<4UL>._M_w[0]._4_4_ =
       *(undefined4 *)((long)(this->p).super__Base_bitset<4UL>._M_w + 4);
  local_48.p.super__Base_bitset<4UL>._M_w[1]._0_4_ = (int)(this->p).super__Base_bitset<4UL>._M_w[1];
  local_48.p.super__Base_bitset<4UL>._M_w[1]._4_4_ =
       *(undefined4 *)((long)(this->p).super__Base_bitset<4UL>._M_w + 0xc);
  lVar3 = 0;
  do {
    p_Var1 = local_48.p.super__Base_bitset<4UL>._M_w + lVar3;
    *p_Var1 = ~*p_Var1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pcVar2 = (var->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,pcVar2 + var->_M_string_length);
  ok_cpp(__return_storage_ptr__,&local_48,&local_68,not_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String Cond::ko_cpp( String var, const Cond *not_in ) const {
    Cond tmp = ~ *this;
    return tmp.ok_cpp( var, not_in );
}